

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool gen_shift(DisasContext_conflict12 *ctx,arg_r_conflict *a,
               _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict11 *func)

{
  TCGContext_conflict11 *s;
  undefined1 extraout_AL;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uintptr_t o;
  TCGv_i64 pTVar1;
  TCGv_i64 a2;
  uintptr_t o_4;
  TCGOpcode TVar2;
  uintptr_t o_3;
  TCGv_i64 pTVar3;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  pTVar3 = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  if ((long)a->rs1 == 0) {
    TVar2 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
LAB_00c7f70f:
    tcg_gen_op2_riscv64(s,TVar2,(TCGArg)a1,(TCGArg)pTVar1);
  }
  else if (s->cpu_gpr[a->rs1] != pTVar3) {
    pTVar1 = s->cpu_gpr[a->rs1] + (long)s;
    TVar2 = INDEX_op_mov_i64;
    goto LAB_00c7f70f;
  }
  pTVar1 = (TCGv_i64)((long)a1_00 - (long)s);
  if ((long)a->rs2 == 0) {
    TVar2 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[a->rs2] == pTVar1) goto LAB_00c7f753;
    a2 = s->cpu_gpr[a->rs2] + (long)s;
    TVar2 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(s,TVar2,(TCGArg)a1_00,(TCGArg)a2);
LAB_00c7f753:
  tcg_gen_andi_i64_riscv64(s,pTVar1,pTVar1,0x3f);
  (*func)(s,pTVar3,pTVar3,pTVar1);
  if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != pTVar3)) {
    tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[a->rd] + (long)s),(TCGArg)a1);
  }
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(pTVar3 + (long)s));
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(pTVar1 + (long)s));
  return (_Bool)extraout_AL;
}

Assistant:

static void gen_shift(DisasContext *s1, int op, MemOp ot, int d, int s)
{
    if (s != OR_TMP1)
        gen_op_mov_v_reg(s1, ot, s1->T1, s);
    switch(op) {
    case OP_ROL:
        gen_rot_rm_T1(s1, ot, d, 0);
        break;
    case OP_ROR:
        gen_rot_rm_T1(s1, ot, d, 1);
        break;
    case OP_SHL:
    case OP_SHL1:
        gen_shift_rm_T1(s1, ot, d, 0, 0);
        break;
    case OP_SHR:
        gen_shift_rm_T1(s1, ot, d, 1, 0);
        break;
    case OP_SAR:
        gen_shift_rm_T1(s1, ot, d, 1, 1);
        break;
    case OP_RCL:
        gen_rotc_rm_T1(s1, ot, d, 0);
        break;
    case OP_RCR:
        gen_rotc_rm_T1(s1, ot, d, 1);
        break;
    }
}